

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter_p.h
# Opt level: O0

void __thiscall QCompleterPrivate::~QCompleterPrivate(QCompleterPrivate *this)

{
  QObjectPrivate *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__QCompleterPrivate_00d364d8;
  if (*(long **)(in_RDI + 0x90) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x90) + 0x20))();
  }
  QString::~QString((QString *)0xa72d21);
  QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0xa72d2e);
  QObjectPrivate::~QObjectPrivate(in_RDI);
  return;
}

Assistant:

~QCompleterPrivate() { delete popup; }